

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPConnection.cpp
# Opt level: O1

void __thiscall TCPConnection::Close(TCPConnection *this)

{
  States SVar1;
  
  SVar1 = this->State;
  if (SVar1 - LISTEN < 2) {
    this->State = CLOSED;
  }
  else if (SVar1 - SYN_RECEIVED < 2) {
    SendFlags(this,'\x01');
    this->State = FIN_WAIT_1;
    this->SequenceNumber = this->SequenceNumber + 1;
  }
  else if (SVar1 == CLOSE_WAIT) {
    SendFlags(this,'\x01');
    this->SequenceNumber = this->SequenceNumber + 1;
    this->State = LAST_ACK;
  }
  return;
}

Assistant:

void TCPConnection::Close()
{
    switch (State)
    {
    case LISTEN:
    case SYN_SENT: State = CLOSED; break;
    case SYN_RECEIVED:
    case ESTABLISHED:
        SendFlags(FLAG_FIN);
        State = FIN_WAIT_1;
        SequenceNumber++; // FIN consumes a sequence number
        break;
    case CLOSE_WAIT:
        SendFlags(FLAG_FIN);
        SequenceNumber++; // FIN consumes a sequence number
        State = LAST_ACK;
        break;
    case CLOSED: break;
    case FIN_WAIT_1: break;
    case FIN_WAIT_2: break;
    case CLOSING: break;
    case LAST_ACK: break;
    case TIMED_WAIT: break;
    case TTCP_PERSIST: break;
    }
}